

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURLcode curl_easy_pause(Curl_easy *data,int action)

{
  uint uVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 uVar4;
  CURLcode CVar5;
  ulong uVar6;
  long lVar7;
  tempbuf writebuf [3];
  size_t local_78 [2];
  int aiStack_68 [16];
  
  uVar1 = (action & 1U) * 0x10 + (action & 4U) * 8;
  (data->req).keepon = (data->req).keepon & 0xffffffcfU | uVar1;
  CVar5 = CURLE_OK;
  if (((action & 1U) == 0) && (uVar6 = (ulong)(data->state).tempcount, CVar5 = CURLE_OK, uVar6 != 0)
     ) {
    lVar3 = uVar6 * 0x18;
    lVar7 = 0;
    do {
      *(undefined8 *)((long)aiStack_68 + lVar7) =
           *(undefined8 *)((long)&(data->state).tempwrite[0].type + lVar7);
      puVar2 = (undefined8 *)((long)&(data->state).tempwrite[0].buf + lVar7);
      uVar4 = puVar2[1];
      *(undefined8 *)((long)local_78 + lVar7) = *puVar2;
      *(undefined8 *)((long)local_78 + lVar7 + 8) = uVar4;
      *(undefined8 *)((long)&(data->state).tempwrite[0].buf + lVar7) = 0;
      lVar7 = lVar7 + 0x18;
    } while (lVar3 != lVar7);
    (data->state).tempcount = 0;
    lVar7 = 0;
    CVar5 = CURLE_OK;
    do {
      if (CVar5 == CURLE_OK) {
        CVar5 = Curl_client_chop_write
                          (data->easy_conn,*(int *)((long)aiStack_68 + lVar7),
                           *(char **)((long)local_78 + lVar7),
                           *(size_t *)((long)local_78 + lVar7 + 8));
      }
      (*Curl_cfree)(*(void **)((long)local_78 + lVar7));
      lVar7 = lVar7 + 0x18;
    } while (lVar3 != lVar7);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
  }
  if (uVar1 != 0x30) {
    Curl_expire(data,0,EXPIRE_RUN_NOW);
  }
  return CVar5;
}

Assistant:

CURLcode curl_easy_pause(struct Curl_easy *data, int action)
{
  struct SingleRequest *k = &data->req;
  CURLcode result = CURLE_OK;

  /* first switch off both pause bits */
  int newstate = k->keepon &~ (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE);

  /* set the new desired pause bits */
  newstate |= ((action & CURLPAUSE_RECV)?KEEP_RECV_PAUSE:0) |
    ((action & CURLPAUSE_SEND)?KEEP_SEND_PAUSE:0);

  /* put it back in the keepon */
  k->keepon = newstate;

  if(!(newstate & KEEP_RECV_PAUSE) && data->state.tempcount) {
    /* there are buffers for sending that can be delivered as the receive
       pausing is lifted! */
    unsigned int i;
    unsigned int count = data->state.tempcount;
    struct tempbuf writebuf[3]; /* there can only be three */

    /* copy the structs to allow for immediate re-pausing */
    for(i=0; i < data->state.tempcount; i++) {
      writebuf[i] = data->state.tempwrite[i];
      data->state.tempwrite[i].buf = NULL;
    }
    data->state.tempcount = 0;

    for(i=0; i < count; i++) {
      /* even if one function returns error, this loops through and frees all
         buffers */
      if(!result)
        result = Curl_client_chop_write(data->easy_conn,
                                        writebuf[i].type,
                                        writebuf[i].buf,
                                        writebuf[i].len);
      free(writebuf[i].buf);
    }
    if(result)
      return result;
  }

  /* if there's no error and we're not pausing both directions, we want
     to have this handle checked soon */
  if(!result &&
     ((newstate&(KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) !=
      (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) )
    Curl_expire(data, 0, EXPIRE_RUN_NOW); /* get this handle going again */

  return result;
}